

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicSceneBuilder::Texture
          (BasicSceneBuilder *this,string *origName,string *type,string *texname,
          ParsedParameterVector *params,FileLoc loc)

{
  bool bVar1;
  string *in_RSI;
  long in_RDI;
  ParameterDictionary *in_R8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names;
  ParameterDictionary dict;
  string name;
  ParameterDictionary *in_stack_fffffffffffff0a8;
  ParameterDictionary *in_stack_fffffffffffff0b0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffff0b8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffff0c0;
  value_type *in_stack_fffffffffffff0c8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff0d0;
  char (*in_stack_fffffffffffff0e0) [8];
  undefined6 in_stack_fffffffffffff0e8;
  undefined1 in_stack_fffffffffffff0ee;
  undefined1 in_stack_fffffffffffff0ef;
  FileLoc *in_stack_fffffffffffff0f0;
  RGBColorSpace *in_stack_fffffffffffff0f8;
  ParsedParameterVector *in_stack_fffffffffffff100;
  undefined5 in_stack_fffffffffffff108;
  undefined1 in_stack_fffffffffffff10d;
  undefined1 in_stack_fffffffffffff10e;
  undefined1 in_stack_fffffffffffff10f;
  string *in_stack_fffffffffffff138;
  AnimatedTransform *in_stack_fffffffffffff178;
  ParameterDictionary *in_stack_fffffffffffff180;
  string *in_stack_fffffffffffff188;
  TransformedSceneEntity *in_stack_fffffffffffff190;
  FileLoc in_stack_fffffffffffff1a0;
  BasicSceneBuilder *in_stack_fffffffffffff1c0;
  string local_840 [304];
  TextureSceneEntity *in_stack_fffffffffffff8f0;
  string *in_stack_fffffffffffff8f8;
  BasicScene *in_stack_fffffffffffff900;
  TextureSceneEntity *in_stack_fffffffffffffc60;
  string *in_stack_fffffffffffffc68;
  BasicScene *in_stack_fffffffffffffc70;
  string local_198 [32];
  _Base_ptr local_178;
  undefined1 local_170;
  _Self local_168;
  _Self local_160;
  long local_158;
  undefined4 local_14c;
  string local_68 [32];
  string local_48 [72];
  
  std::__cxx11::string::string(local_68,in_RSI);
  NormalizeUTF8(in_stack_fffffffffffff138);
  std::__cxx11::string::~string(local_68);
  if (*(int *)(in_RDI + 0x18) != 0) {
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::InlinedVector(in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8);
    ParameterDictionary::ParameterDictionary
              (in_R8,(ParsedParameterVector *)
                     CONCAT17(in_stack_fffffffffffff10f,
                              CONCAT16(in_stack_fffffffffffff10e,
                                       CONCAT15(in_stack_fffffffffffff10d,in_stack_fffffffffffff108)
                                      )),in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&in_stack_fffffffffffff0b0->params);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff0b0,(char *)in_stack_fffffffffffff0a8);
    if ((bVar1) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff0b0,(char *)in_stack_fffffffffffff0a8), bVar1
       )) {
      ParserTarget::ErrorExitDeferred<std::__cxx11::string_const&>
                ((ParserTarget *)in_stack_fffffffffffff0c0,(FileLoc *)in_stack_fffffffffffff0b8,
                 (char *)in_stack_fffffffffffff0b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff0a8);
      local_14c = 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff0b0,(char *)in_stack_fffffffffffff0a8);
      if (bVar1) {
        local_158 = in_RDI + 0x688;
      }
      else {
        local_158 = in_RDI + 0x6b8;
      }
      local_160._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff0b8,(key_type *)in_stack_fffffffffffff0b0);
      local_168._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff0a8);
      bVar1 = std::operator!=(&local_160,&local_168);
      if (bVar1) {
        ParserTarget::ErrorExitDeferred<std::__cxx11::string&>
                  ((ParserTarget *)in_stack_fffffffffffff0c0,(FileLoc *)in_stack_fffffffffffff0b8,
                   (char *)in_stack_fffffffffffff0b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff0a8);
        local_14c = 1;
      }
      else {
        pVar2 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
        local_178 = (_Base_ptr)pVar2.first._M_node;
        local_170 = pVar2.second;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff0b0,(char *)in_stack_fffffffffffff0a8);
        if (bVar1) {
          std::__cxx11::string::string(local_198,local_48);
          ParameterDictionary::ParameterDictionary
                    (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
          RenderFromObject(in_stack_fffffffffffff1c0);
          TransformedSceneEntity::TransformedSceneEntity
                    (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff180,
                     in_stack_fffffffffffff1a0,in_stack_fffffffffffff178);
          BasicScene::AddFloatTexture
                    (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
          TransformedSceneEntity::~TransformedSceneEntity((TransformedSceneEntity *)0x7876ac);
          ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x7876b9);
          std::__cxx11::string::~string(local_198);
        }
        else {
          std::__cxx11::string::string(local_840,local_48);
          ParameterDictionary::ParameterDictionary
                    (in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8);
          RenderFromObject(in_stack_fffffffffffff1c0);
          TransformedSceneEntity::TransformedSceneEntity
                    (in_stack_fffffffffffff190,in_stack_fffffffffffff188,in_stack_fffffffffffff180,
                     in_stack_fffffffffffff1a0,in_stack_fffffffffffff178);
          BasicScene::AddSpectrumTexture
                    (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
          TransformedSceneEntity::~TransformedSceneEntity((TransformedSceneEntity *)0x78781b);
          ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x787828);
          std::__cxx11::string::~string(local_840);
        }
        local_14c = 0;
      }
    }
    ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x7878b8);
    std::__cxx11::string::~string(local_48);
    return;
  }
  ErrorExit<char_const(&)[8]>
            (in_stack_fffffffffffff0f0,
             (char *)CONCAT17(in_stack_fffffffffffff0ef,
                              CONCAT16(in_stack_fffffffffffff0ee,in_stack_fffffffffffff0e8)),
             in_stack_fffffffffffff0e0);
}

Assistant:

void BasicSceneBuilder::Texture(const std::string &origName, const std::string &type,
                                const std::string &texname, ParsedParameterVector params,
                                FileLoc loc) {
    std::string name = NormalizeUTF8(origName);
    VERIFY_WORLD("Texture");

    ParameterDictionary dict(std::move(params), graphicsState.textureAttributes,
                             graphicsState.colorSpace);

    if (type != "float" && type != "spectrum") {
        ErrorExitDeferred(
            &loc, "%s: texture type unknown. Must be \"float\" or \"spectrum\".", type);
        return;
    }

    std::set<std::string> &names =
        (type == "float") ? floatTextureNames : spectrumTextureNames;
    if (names.find(name) != names.end()) {
        ErrorExitDeferred(&loc, "Redefining texture \"%s\".", name);
        return;
    }
    names.insert(name);

    if (type == "float")
        scene->AddFloatTexture(
            name, TextureSceneEntity(texname, std::move(dict), loc, RenderFromObject()));
    else
        scene->AddSpectrumTexture(
            name, TextureSceneEntity(texname, std::move(dict), loc, RenderFromObject()));
}